

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O2

void __thiscall mario::EventLoop::assertInLoopThread(EventLoop *this)

{
  bool bVar1;
  
  bVar1 = isInLoopThread(this);
  if (bVar1) {
    return;
  }
  abortNotInLoopThread(this);
  return;
}

Assistant:

void assertInLoopThread() {
		if (!isInLoopThread()) {
			abortNotInLoopThread();
		}
	}